

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabOpen(sqlite3_vtab *pVtab,sqlite3_vtab_cursor **ppCursor)

{
  sqlite3_vtab_cursor *__s;
  PragmaVtabCursor *pCsr;
  sqlite3_vtab_cursor **ppCursor_local;
  sqlite3_vtab *pVtab_local;
  
  __s = (sqlite3_vtab_cursor *)sqlite3_malloc(0x28);
  if (__s == (sqlite3_vtab_cursor *)0x0) {
    pVtab_local._4_4_ = 7;
  }
  else {
    memset(__s,0,0x28);
    __s->pVtab = pVtab;
    *ppCursor = __s;
    pVtab_local._4_4_ = 0;
  }
  return pVtab_local._4_4_;
}

Assistant:

static int pragmaVtabOpen(sqlite3_vtab *pVtab, sqlite3_vtab_cursor **ppCursor){
  PragmaVtabCursor *pCsr;
  pCsr = (PragmaVtabCursor*)sqlite3_malloc(sizeof(*pCsr));
  if( pCsr==0 ) return SQLITE_NOMEM;
  memset(pCsr, 0, sizeof(PragmaVtabCursor));
  pCsr->base.pVtab = pVtab;
  *ppCursor = &pCsr->base;
  return SQLITE_OK;
}